

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O2

void __thiscall HEkk::unitBtran(HEkk *this,HighsInt iRow,HVector *row_ep)

{
  HighsSimplexAnalysis *this_00;
  
  this_00 = &this->analysis_;
  HighsSimplexAnalysis::simplexTimerStart(this_00,0x3c,0);
  HVectorBase<double>::clear(row_ep);
  row_ep->count = 1;
  *(row_ep->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
   _M_start = iRow;
  (row_ep->array).super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start[iRow] = 1.0;
  row_ep->packFlag = true;
  if ((this->analysis_).analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordBefore(this_00,4,row_ep,(this->info_).row_ep_density);
  }
  HSimplexNla::btran(&this->simplex_nla_,row_ep,(this->info_).row_ep_density,
                     (this->analysis_).pointer_serial_factor_clocks);
  if ((this->analysis_).analyse_simplex_summary_data == true) {
    HighsSimplexAnalysis::operationRecordAfter(this_00,4,row_ep);
  }
  updateOperationResultDensity
            (this,(double)row_ep->count / (double)(this->lp_).num_row_,&(this->info_).row_ep_density
            );
  HighsSimplexAnalysis::simplexTimerStop(this_00,0x3c,0);
  return;
}

Assistant:

void HEkk::unitBtran(const HighsInt iRow, HVector& row_ep) {
  analysis_.simplexTimerStart(BtranClock);
  row_ep.clear();
  row_ep.count = 1;
  row_ep.index[0] = iRow;
  row_ep.array[iRow] = 1;
  row_ep.packFlag = true;
  if (analysis_.analyse_simplex_summary_data)
    analysis_.operationRecordBefore(kSimplexNlaBtranEp, row_ep,
                                    info_.row_ep_density);
  simplex_nla_.btran(row_ep, info_.row_ep_density,
                     analysis_.pointer_serial_factor_clocks);
  if (analysis_.analyse_simplex_summary_data)
    analysis_.operationRecordAfter(kSimplexNlaBtranEp, row_ep);
  HighsInt num_row = lp_.num_row_;
  const double local_row_ep_density = (double)row_ep.count / num_row;
  updateOperationResultDensity(local_row_ep_density, info_.row_ep_density);
  analysis_.simplexTimerStop(BtranClock);
}